

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::tracker_logger::tracker_response
          (tracker_logger *this,tracker_request *param_1,address *tracker_ip,
          list<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *tracker_ips,
          tracker_response *resp)

{
  uint uVar1;
  pointer ppVar2;
  pointer pcVar3;
  pointer piVar4;
  pointer piVar5;
  bool bVar6;
  _Alloc_hider _Var7;
  pointer pcVar8;
  address *addr;
  address *extraout_RDX;
  address *extraout_RDX_00;
  address *extraout_RDX_01;
  address *extraout_RDX_02;
  address *extraout_RDX_03;
  address *extraout_RDX_04;
  address *extraout_RDX_05;
  address *extraout_RDX_06;
  address *extraout_RDX_07;
  address *extraout_RDX_08;
  address *addr_00;
  peer_entry *p;
  pointer ppVar9;
  pointer piVar10;
  ipv4_peer_entry *p_1;
  pointer piVar11;
  span<const_char> in;
  vector<libtorrent::aux::peer_entry,_std::allocator<libtorrent::aux::peer_entry>_> *__range2;
  string local_90;
  tracker_response *local_70;
  string local_68;
  size_type local_48;
  size_type sStack_40;
  
  uVar1 = (resp->interval).__r;
  local_70 = resp;
  print_address_abi_cxx11_(&local_90,(aux *)&resp->external_ip,tracker_ip);
  _Var7._M_p = local_90._M_dataplus._M_p;
  print_address_abi_cxx11_(&local_68,(aux *)tracker_ip,addr);
  (*(this->super_request_callback)._vptr_request_callback[7])
            (this,"TRACKER RESPONSE\ninterval: %d\nexternal ip: %s\nwe connected to: %s\npeers:",
             (ulong)uVar1,_Var7._M_p,local_68._M_dataplus._M_p);
  addr_00 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    addr_00 = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    addr_00 = extraout_RDX_01;
  }
  ppVar2 = (local_70->peers).
           super__Vector_base<libtorrent::aux::peer_entry,_std::allocator<libtorrent::aux::peer_entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar9 = (local_70->peers).
                super__Vector_base<libtorrent::aux::peer_entry,_std::allocator<libtorrent::aux::peer_entry>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar9 != ppVar2; ppVar9 = ppVar9 + 1) {
    pcVar3 = (ppVar9->hostname)._M_dataplus._M_p;
    pcVar8 = (pointer)(ulong)ppVar9->port;
    bVar6 = digest32<160L>::is_all_zeros(&ppVar9->pid);
    if (bVar6) {
      (*(this->super_request_callback)._vptr_request_callback[7])
                (this,"  %16s %5d %s",pcVar3,pcVar8,"");
      addr_00 = extraout_RDX_02;
    }
    else {
      in.m_len = (difference_type)_Var7._M_p;
      in.m_ptr = (char *)0x14;
      to_hex_abi_cxx11_(&local_90,(aux *)&ppVar9->pid,in);
      (*(this->super_request_callback)._vptr_request_callback[7])
                (this,"  %16s %5d %s",pcVar3,pcVar8,local_90._M_dataplus._M_p);
      addr_00 = extraout_RDX_03;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        addr_00 = extraout_RDX_04;
      }
    }
    _Var7._M_p = pcVar8;
  }
  piVar11 = (local_70->peers4).
            super__Vector_base<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
            ._M_impl.super__Vector_impl_data._M_start;
  piVar4 = (local_70->peers4).
           super__Vector_base<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (piVar11 != piVar4) {
    do {
      local_68._M_dataplus._M_p = (pointer)((ulong)*(uint *)(piVar11->ip)._M_elems << 0x20);
      local_68._M_string_length = 0;
      local_68.field_2._M_allocated_capacity = 0;
      local_68.field_2._8_8_ = 0;
      print_address_abi_cxx11_(&local_90,(aux *)&local_68,addr_00);
      (*(this->super_request_callback)._vptr_request_callback[7])
                (this,"  %s:%d",local_90._M_dataplus._M_p,(ulong)piVar11->port);
      addr_00 = extraout_RDX_05;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        addr_00 = extraout_RDX_06;
      }
      piVar11 = piVar11 + 1;
    } while (piVar11 != piVar4);
  }
  piVar10 = (local_70->peers6).
            super__Vector_base<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
            ._M_impl.super__Vector_impl_data._M_start;
  piVar5 = (local_70->peers6).
           super__Vector_base<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (piVar10 != piVar5) {
    do {
      local_68._M_string_length = *(size_type *)(piVar10->ip)._M_elems;
      local_68.field_2._M_allocated_capacity = *(undefined8 *)((piVar10->ip)._M_elems + 8);
      local_68._M_dataplus._M_p = (pointer)0x1;
      local_68.field_2._8_8_ = 0;
      local_48 = local_68._M_string_length;
      sStack_40 = local_68.field_2._M_allocated_capacity;
      print_address_abi_cxx11_(&local_90,(aux *)&local_68,addr_00);
      (*(this->super_request_callback)._vptr_request_callback[7])
                (this,"  [%s]:%d",local_90._M_dataplus._M_p,(ulong)piVar10->port);
      addr_00 = extraout_RDX_07;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        addr_00 = extraout_RDX_08;
      }
      piVar10 = piVar10 + 1;
    } while (piVar10 != piVar5);
  }
  return;
}

Assistant:

void tracker_logger::tracker_response(tracker_request const&
			, libtorrent::address const& tracker_ip
			, std::list<address> const& tracker_ips
			, struct tracker_response const& resp)
		{
			TORRENT_UNUSED(tracker_ips);
			debug_log("TRACKER RESPONSE\n"
				"interval: %d\n"
				"external ip: %s\n"
				"we connected to: %s\n"
				"peers:"
				, resp.interval.count()
				, print_address(resp.external_ip).c_str()
				, print_address(tracker_ip).c_str());

			for (auto const& p : resp.peers)
			{
				debug_log("  %16s %5d %s", p.hostname.c_str(), p.port
					, p.pid.is_all_zeros() ? "" : to_hex(p.pid).c_str());
			}
			for (auto const& p : resp.peers4)
			{
				debug_log("  %s:%d", print_address(address_v4(p.ip)).c_str(), p.port);
			}
			for (auto const& p : resp.peers6)
			{
				debug_log("  [%s]:%d", print_address(address_v6(p.ip)).c_str(), p.port);
			}
		}